

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Backward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  double dVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  complex<double> *pcVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  undefined8 uVar19;
  long local_98;
  complex<double> local_58;
  double local_48;
  double dStack_40;
  
  lVar11 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar8 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar11 != CONCAT44(extraout_var,iVar8)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
  }
  iVar8 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar11 = CONCAT44(extraout_var_00,iVar8);
  if ((lVar11 != 0) && (0 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    lVar13 = lVar11 * 0x10 + -8;
    lVar9 = lVar11 * 0x10 + -0x20;
    local_98 = 0;
    lVar12 = 0;
    lVar10 = lVar9;
    lVar16 = lVar13;
    lVar14 = lVar11;
LAB_00cc1535:
    do {
      lVar18 = lVar10;
      if (1 < lVar14) {
        lVar10 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar10 < lVar14) ||
           ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar12)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar10 = lVar10 * local_98;
        dVar1 = *(double *)(B->fElem->_M_value + lVar16 + -8 + lVar10);
        lVar14 = lVar14 + -1;
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          dVar1 = *(double *)(B->fElem->_M_value + lVar16 + lVar10);
          if ((dVar1 == 0.0) && (lVar10 = lVar18 + -0x10, lVar16 = lVar16 + -0x10, !NAN(dVar1)))
          goto LAB_00cc1535;
        }
        do {
          local_58._M_value._0_8_ = 0;
          local_58._M_value._8_8_ = 0;
          ppcVar2 = (this->fElem).fStore;
          pcVar15 = ppcVar2[lVar14];
          pcVar3 = ppcVar2[lVar14 + 1];
          lVar10 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar10 <= lVar14) ||
             ((B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar12)) {
            TPZFMatrix<std::complex<double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = B->fElem;
          lVar16 = lVar10 * lVar12;
          uVar19 = *(undefined8 *)(pcVar4[lVar16 + lVar14]._M_value + 8);
          uVar6 = __divdc3((int)*(undefined8 *)pcVar4[lVar16 + lVar14]._M_value,uVar19,
                           *(undefined8 *)pcVar15->_M_value,*(undefined8 *)(pcVar15->_M_value + 8));
          *(undefined8 *)pcVar4[lVar16 + lVar14]._M_value = uVar6;
          *(undefined8 *)(pcVar4[lVar16 + lVar14]._M_value + 8) = uVar19;
          local_58._M_value._0_8_ = *(undefined8 *)pcVar4[lVar16 + lVar14]._M_value;
          local_58._M_value._8_8_ = *(undefined8 *)(pcVar4[lVar16 + lVar14]._M_value + 8);
          pcVar15 = pcVar15 + 1;
          if (pcVar15 < pcVar3) {
            pauVar17 = (undefined1 (*) [16])(pcVar4->_M_value + lVar10 * local_98 + lVar18);
            do {
              local_48 = *(double *)pcVar15->_M_value;
              dStack_40 = *(double *)(pcVar15->_M_value + 8);
              std::complex<double>::operator*=((complex<double> *)&local_48,&local_58);
              dVar1 = *(double *)(*pauVar17 + 8) - dStack_40;
              auVar7._8_4_ = SUB84(dVar1,0);
              auVar7._0_8_ = *(double *)*pauVar17 - local_48;
              auVar7._12_4_ = (int)((ulong)dVar1 >> 0x20);
              *pauVar17 = auVar7;
              pcVar15 = pcVar15 + 1;
              pauVar17 = pauVar17 + -1;
            } while (pcVar15 < pcVar3);
          }
          lVar18 = lVar18 + -0x10;
          bVar5 = 1 < lVar14;
          lVar14 = lVar14 + -1;
        } while (bVar5);
      }
      lVar12 = lVar12 + 1;
      lVar18 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
      local_98 = local_98 + 0x10;
      lVar10 = lVar9;
      lVar16 = lVar13;
      lVar14 = lVar11;
    } while (lVar12 < lVar18);
    if (0 < lVar18) {
      lVar11 = 0;
      do {
        pcVar15 = *(this->fElem).fStore;
        lVar13 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
        if (lVar13 < 1) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar3 = B->fElem;
        lVar13 = lVar13 * lVar11;
        uVar19 = *(undefined8 *)(pcVar3[lVar13]._M_value + 8);
        uVar6 = __divdc3((int)*(undefined8 *)pcVar3[lVar13]._M_value,uVar19,
                         *(undefined8 *)pcVar15->_M_value,*(undefined8 *)(pcVar15->_M_value + 8));
        *(undefined8 *)pcVar3[lVar13]._M_value = uVar6;
        *(undefined8 *)(pcVar3[lVar13]._M_value + 8) = uVar19;
        lVar11 = lVar11 + 1;
      } while (lVar11 < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}